

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap_opkill.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::WrapOpKill::ReplaceWithFunctionCall(WrapOpKill *this,Instruction *inst)

{
  IRContext *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  InstructionBuilder ir_builder;
  InstructionBuilder local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if ((inst->opcode_ != OpTerminateInvocation) && (inst->opcode_ != OpKill)) {
    __assert_fail("(inst->opcode() == spv::Op::OpKill || inst->opcode() == spv::Op::OpTerminateInvocation) && \"|inst| must be an OpKill or OpTerminateInvocation instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/wrap_opkill.cpp"
                  ,0x3e,"bool spvtools::opt::WrapOpKill::ReplaceWithFunctionCall(Instruction *)");
  }
  this_00 = (this->super_Pass).context_;
  local_68.parent_ = IRContext::get_instr_block(this_00,inst);
  local_68.preserved_analyses_ = kAnalysisInstrToBlockMapping|kAnalysisBegin;
  local_68.context_ = this_00;
  local_68.insert_before_.super_iterator.node_ = (iterator)(iterator)inst;
  uVar1 = GetKillingFuncId(this,inst->opcode_);
  if (uVar1 != 0) {
    uVar2 = GetVoidTypeId(this);
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar3 = InstructionBuilder::AddFunctionCall(&local_68,uVar2,uVar1,&local_48);
    if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pIVar3 != (Instruction *)0x0) {
      Instruction::UpdateDebugInfoFrom(pIVar3,inst);
      uVar1 = GetOwningFunctionsReturnType(this,inst);
      uVar2 = GetVoidTypeId(this);
      if (uVar1 == uVar2) {
        pIVar4 = InstructionBuilder::AddNullaryOp(&local_68,0,OpReturn);
      }
      else {
        pIVar3 = InstructionBuilder::AddNullaryOp(&local_68,uVar1,OpUndef);
        pIVar4 = (Instruction *)0x0;
        uVar1 = 0;
        if (pIVar3 != (Instruction *)0x0) {
          if (pIVar3->has_result_id_ == true) {
            uVar1 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
          }
          pIVar4 = InstructionBuilder::AddUnaryOp(&local_68,0,OpReturnValue,uVar1);
        }
        if (pIVar3 == (Instruction *)0x0) {
          return false;
        }
      }
      if (pIVar4 != (Instruction *)0x0) {
        IRContext::KillInst((this->super_Pass).context_,inst);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool WrapOpKill::ReplaceWithFunctionCall(Instruction* inst) {
  assert((inst->opcode() == spv::Op::OpKill ||
          inst->opcode() == spv::Op::OpTerminateInvocation) &&
         "|inst| must be an OpKill or OpTerminateInvocation instruction.");
  InstructionBuilder ir_builder(
      context(), inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  uint32_t func_id = GetKillingFuncId(inst->opcode());
  if (func_id == 0) {
    return false;
  }
  Instruction* call_inst =
      ir_builder.AddFunctionCall(GetVoidTypeId(), func_id, {});
  if (call_inst == nullptr) {
    return false;
  }
  call_inst->UpdateDebugInfoFrom(inst);

  Instruction* return_inst = nullptr;
  uint32_t return_type_id = GetOwningFunctionsReturnType(inst);
  if (return_type_id != GetVoidTypeId()) {
    Instruction* undef =
        ir_builder.AddNullaryOp(return_type_id, spv::Op::OpUndef);
    if (undef == nullptr) {
      return false;
    }
    return_inst =
        ir_builder.AddUnaryOp(0, spv::Op::OpReturnValue, undef->result_id());
  } else {
    return_inst = ir_builder.AddNullaryOp(0, spv::Op::OpReturn);
  }

  if (return_inst == nullptr) {
    return false;
  }

  context()->KillInst(inst);
  return true;
}